

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationUtil.cpp
# Opt level: O3

GraphicsPipelineBuilder * __thiscall
vkt::synchronization::GraphicsPipelineBuilder::setShader
          (GraphicsPipelineBuilder *this,DeviceInterface *vk,VkDevice device,
          VkShaderStageFlagBits stage,ProgramBinary *binary,VkSpecializationInfo *specInfo)

{
  pointer *ppVVar1;
  VkShaderModule VVar2;
  iterator __position;
  Move<vk::Handle<(vk::HandleType)14>_> *pMVar3;
  VkPipelineShaderStageCreateInfo pipelineShaderStageInfo;
  undefined1 local_78 [24];
  VkShaderModule VStack_60;
  char *local_58;
  VkSpecializationInfo *pVStack_50;
  Move<vk::Handle<(vk::HandleType)14>_> local_48;
  
  switch(stage) {
  case VK_SHADER_STAGE_VERTEX_BIT:
    ::vk::createShaderModule(&local_48,vk,device,binary,0);
    local_78._16_8_ =
         local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device;
    VStack_60.m_internal =
         (deUint64)
         local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator;
    local_78._0_8_ =
         local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal;
    local_78._8_8_ =
         local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_deviceIface;
    local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal = 0;
    local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device = (VkDevice)0x0;
    local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    pMVar3 = &this->m_vertexShaderModule;
    VVar2.m_internal =
         (this->m_vertexShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
         m_internal;
    if (VVar2.m_internal == 0) {
LAB_007ccdc3:
      local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device =
           (VkDevice)0x0;
      local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)0x0;
      local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal = 0;
      (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.deleter.m_device =
           (VkDevice)local_78._16_8_;
      (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)VStack_60.m_internal;
      (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal =
           local_78._0_8_;
      (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.deleter.m_deviceIface =
           (DeviceInterface *)local_78._8_8_;
    }
    else {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
                (&(this->m_vertexShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data
                  .deleter,VVar2);
      (this->m_vertexShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
      m_device = (VkDevice)local_78._16_8_;
      (this->m_vertexShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
      m_allocator = (VkAllocationCallbacks *)VStack_60.m_internal;
      (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal =
           local_78._0_8_;
      (this->m_vertexShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
      m_deviceIface = (DeviceInterface *)local_78._8_8_;
      if (local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
                  (&local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter,
                   (VkShaderModule)
                   local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal)
        ;
      }
    }
    break;
  case VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT:
    ::vk::createShaderModule(&local_48,vk,device,binary,0);
    local_78._16_8_ =
         local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device;
    VStack_60.m_internal =
         (deUint64)
         local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator;
    local_78._0_8_ =
         local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal;
    local_78._8_8_ =
         local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_deviceIface;
    local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal = 0;
    local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device = (VkDevice)0x0;
    local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    pMVar3 = &this->m_tessControlShaderModule;
    VVar2.m_internal =
         (this->m_tessControlShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
         object.m_internal;
    if (VVar2.m_internal == 0) goto LAB_007ccdc3;
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              (&(this->m_tessControlShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.
                m_data.deleter,VVar2);
    (this->m_tessControlShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
    m_device = (VkDevice)local_78._16_8_;
    (this->m_tessControlShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)VStack_60.m_internal;
    (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal =
         local_78._0_8_;
    (this->m_tessControlShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)local_78._8_8_;
    if (local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
                (&local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter,
                 (VkShaderModule)
                 local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal);
    }
    break;
  case VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT|VK_SHADER_STAGE_VERTEX_BIT:
  case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT|VK_SHADER_STAGE_VERTEX_BIT:
  case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT|VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT:
  case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT|VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT|
       VK_SHADER_STAGE_VERTEX_BIT:
    goto switchD_007ccb39_caseD_3;
  case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT:
    ::vk::createShaderModule(&local_48,vk,device,binary,0);
    local_78._16_8_ =
         local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device;
    VStack_60.m_internal =
         (deUint64)
         local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator;
    local_78._0_8_ =
         local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal;
    local_78._8_8_ =
         local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_deviceIface;
    local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal = 0;
    local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device = (VkDevice)0x0;
    local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    pMVar3 = &this->m_tessEvaluationShaderModule;
    VVar2.m_internal =
         (this->m_tessEvaluationShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
         object.m_internal;
    if (VVar2.m_internal == 0) goto LAB_007ccdc3;
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              (&(this->m_tessEvaluationShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.
                m_data.deleter,VVar2);
    (this->m_tessEvaluationShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
    deleter.m_device = (VkDevice)local_78._16_8_;
    (this->m_tessEvaluationShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
    deleter.m_allocator = (VkAllocationCallbacks *)VStack_60.m_internal;
    (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal =
         local_78._0_8_;
    (this->m_tessEvaluationShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
    deleter.m_deviceIface = (DeviceInterface *)local_78._8_8_;
    if (local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
                (&local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter,
                 (VkShaderModule)
                 local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal);
    }
    break;
  case VK_SHADER_STAGE_GEOMETRY_BIT:
    ::vk::createShaderModule(&local_48,vk,device,binary,0);
    local_78._16_8_ =
         local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device;
    VStack_60.m_internal =
         (deUint64)
         local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator;
    local_78._0_8_ =
         local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal;
    local_78._8_8_ =
         local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_deviceIface;
    local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal = 0;
    local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device = (VkDevice)0x0;
    local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    pMVar3 = &this->m_geometryShaderModule;
    VVar2.m_internal =
         (this->m_geometryShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object
         .m_internal;
    if (VVar2.m_internal == 0) goto LAB_007ccdc3;
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              (&(this->m_geometryShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data
                .deleter,VVar2);
    (this->m_geometryShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
    m_device = (VkDevice)local_78._16_8_;
    (this->m_geometryShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)VStack_60.m_internal;
    (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal =
         local_78._0_8_;
    (this->m_geometryShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)local_78._8_8_;
    if (local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
                (&local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter,
                 (VkShaderModule)
                 local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal);
    }
    break;
  default:
    if (stage != VK_SHADER_STAGE_FRAGMENT_BIT) {
      return this;
    }
    ::vk::createShaderModule(&local_48,vk,device,binary,0);
    local_78._16_8_ =
         local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device;
    VStack_60.m_internal =
         (deUint64)
         local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator;
    local_78._0_8_ =
         local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal;
    local_78._8_8_ =
         local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_deviceIface;
    local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal = 0;
    local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device = (VkDevice)0x0;
    local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    pMVar3 = &this->m_fragmentShaderModule;
    VVar2.m_internal =
         (this->m_fragmentShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object
         .m_internal;
    if (VVar2.m_internal == 0) goto LAB_007ccdc3;
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              (&(this->m_fragmentShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data
                .deleter,VVar2);
    (this->m_fragmentShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
    m_device = (VkDevice)local_78._16_8_;
    (this->m_fragmentShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)VStack_60.m_internal;
    (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal =
         local_78._0_8_;
    (this->m_fragmentShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)local_78._8_8_;
    if (local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
                (&local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter,
                 (VkShaderModule)
                 local_48.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal);
    }
  }
  VStack_60.m_internal =
       (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal;
  local_78._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
  local_78._8_8_ = (void *)0x0;
  local_78._16_8_ = (ulong)stage << 0x20;
  local_58 = "main";
  this->m_shaderStageFlags = this->m_shaderStageFlags | stage;
  __position._M_current =
       (this->m_shaderStages).
       super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_shaderStages).
      super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    pVStack_50 = specInfo;
    std::
    vector<vk::VkPipelineShaderStageCreateInfo,std::allocator<vk::VkPipelineShaderStageCreateInfo>>
    ::_M_realloc_insert<vk::VkPipelineShaderStageCreateInfo_const&>
              ((vector<vk::VkPipelineShaderStageCreateInfo,std::allocator<vk::VkPipelineShaderStageCreateInfo>>
                *)&this->m_shaderStages,__position,(VkPipelineShaderStageCreateInfo *)local_78);
  }
  else {
    (__position._M_current)->pName = "main";
    (__position._M_current)->pSpecializationInfo = specInfo;
    (__position._M_current)->flags = local_78._16_4_;
    (__position._M_current)->stage = local_78._20_4_;
    ((__position._M_current)->module).m_internal = VStack_60.m_internal;
    *(undefined8 *)__position._M_current = local_78._0_8_;
    (__position._M_current)->pNext = (void *)0x0;
    ppVVar1 = &(this->m_shaderStages).
               super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppVVar1 = *ppVVar1 + 1;
  }
switchD_007ccb39_caseD_3:
  return this;
}

Assistant:

GraphicsPipelineBuilder& GraphicsPipelineBuilder::setShader (const DeviceInterface&			vk,
															 const VkDevice					device,
															 const VkShaderStageFlagBits	stage,
															 const ProgramBinary&			binary,
															 const VkSpecializationInfo*	specInfo)
{
	VkShaderModule module;
	switch (stage)
	{
		case (VK_SHADER_STAGE_VERTEX_BIT):
			DE_ASSERT(m_vertexShaderModule.get() == DE_NULL);
			m_vertexShaderModule = createShaderModule(vk, device, binary, (VkShaderModuleCreateFlags)0);
			module = *m_vertexShaderModule;
			break;

		case (VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT):
			DE_ASSERT(m_tessControlShaderModule.get() == DE_NULL);
			m_tessControlShaderModule = createShaderModule(vk, device, binary, (VkShaderModuleCreateFlags)0);
			module = *m_tessControlShaderModule;
			break;

		case (VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT):
			DE_ASSERT(m_tessEvaluationShaderModule.get() == DE_NULL);
			m_tessEvaluationShaderModule = createShaderModule(vk, device, binary, (VkShaderModuleCreateFlags)0);
			module = *m_tessEvaluationShaderModule;
			break;

		case (VK_SHADER_STAGE_GEOMETRY_BIT):
			DE_ASSERT(m_geometryShaderModule.get() == DE_NULL);
			m_geometryShaderModule = createShaderModule(vk, device, binary, (VkShaderModuleCreateFlags)0);
			module = *m_geometryShaderModule;
			break;

		case (VK_SHADER_STAGE_FRAGMENT_BIT):
			DE_ASSERT(m_fragmentShaderModule.get() == DE_NULL);
			m_fragmentShaderModule = createShaderModule(vk, device, binary, (VkShaderModuleCreateFlags)0);
			module = *m_fragmentShaderModule;
			break;

		default:
			DE_FATAL("Invalid shader stage");
			return *this;
	}

	const VkPipelineShaderStageCreateInfo pipelineShaderStageInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,	// VkStructureType						sType;
		DE_NULL,												// const void*							pNext;
		(VkPipelineShaderStageCreateFlags)0,					// VkPipelineShaderStageCreateFlags		flags;
		stage,													// VkShaderStageFlagBits				stage;
		module,													// VkShaderModule						module;
		"main",													// const char*							pName;
		specInfo,												// const VkSpecializationInfo*			pSpecializationInfo;
	};

	m_shaderStageFlags |= stage;
	m_shaderStages.push_back(pipelineShaderStageInfo);

	return *this;
}